

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionWrapper.cpp
# Opt level: O1

Statement * __thiscall
IRT::ExpressionWrapper::ToConditional(ExpressionWrapper *this,Label *true_label,Label *false_label)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Expression *left;
  pointer pcVar2;
  JumpConditionalStatement *this_00;
  ConstExpression *this_01;
  Label local_70;
  Label local_50;
  
  this_00 = (JumpConditionalStatement *)operator_new(0x60);
  left = this->expression_;
  this_01 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(this_01,0);
  local_50.label_._M_dataplus._M_p = (pointer)&local_50.label_.field_2;
  pcVar2 = (true_label->label_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (true_label->label_)._M_string_length);
  paVar1 = &local_70.label_.field_2;
  pcVar2 = (false_label->label_)._M_dataplus._M_p;
  local_70.label_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (false_label->label_)._M_string_length);
  JumpConditionalStatement::JumpConditionalStatement
            (this_00,NE,left,(Expression *)this_01,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.label_._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.label_._M_dataplus._M_p,
                    local_70.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.label_._M_dataplus._M_p != &local_50.label_.field_2) {
    operator_delete(local_50.label_._M_dataplus._M_p,
                    local_50.label_.field_2._M_allocated_capacity + 1);
  }
  return &this_00->super_Statement;
}

Assistant:

IRT::Statement *IRT::ExpressionWrapper::ToConditional(IRT::Label true_label, IRT::Label false_label) {
    return new JumpConditionalStatement(
          LogicOperatorType::NE,
          expression_,
          new ConstExpression(0),
          true_label,
          false_label
    );
}